

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall IndexNode<float>::IndexNode(IndexNode<float> *this,int N)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pAVar5;
  ulong uVar6;
  pointer pAVar7;
  size_type __n;
  allocator_type local_39;
  undefined1 local_38 [16];
  pointer local_28;
  
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __n = (size_type)N;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38,__n,&local_39);
  pfVar1 = (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_38._0_8_;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_28;
  local_38 = ZEXT816(0);
  local_28 = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
    }
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,__n,(allocator_type *)&local_39);
  pcVar3 = (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar4 = (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_38._0_8_;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_28;
  local_38 = ZEXT816(0);
  local_28 = (pointer)0x0;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
    }
  }
  std::vector<Addr,_std::allocator<Addr>_>::vector
            ((vector<Addr,_std::allocator<Addr>_> *)local_38,__n,(allocator_type *)&local_39);
  pAVar7 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pAVar5 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_38._0_8_;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  local_38 = (undefined1  [16])0x0;
  local_28 = (pointer)0x0;
  if (pAVar7 != (pointer)0x0) {
    operator_delete(pAVar7,(long)pAVar5 - (long)pAVar7);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
    }
  }
  this->NodeState = '0';
  (this->parent).BlockNum = -1;
  (this->parent).FileOff = -1;
  (this->self).BlockNum = -1;
  (this->self).FileOff = -1;
  if (N < 2) {
    pAVar7 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    uVar6 = 0;
    do {
      (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = '0';
      pAVar7 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar7[uVar6].BlockNum = -1;
      pAVar7[uVar6].FileOff = -1;
      uVar6 = uVar6 + 1;
    } while (N - 1U != uVar6);
  }
  pAVar7[(int)(N - 1U)].BlockNum = -1;
  pAVar7[(int)(N - 1U)].FileOff = -1;
  return;
}

Assistant:

IndexNode<K>::IndexNode(int N) {
	int i;
	k = vector<K>(N);
	v = vector<char>(N);
	p = vector<Addr>(N);
	this->NodeState = INTERNAL;
	this->parent = { -1, -1 };
	this->self = { -1, -1 };
	for (i = 0; i < N - 1; i++) {
		this->v[i] = '0';
		this->p[i] = { -1, -1 };
	}
	this->p[N - 1] = { -1, -1 };
}